

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

int pageant_reencrypt_all_keys(char **retstr)

{
  uint uVar1;
  PageantClientOp *pco_00;
  unsigned_long uVar2;
  char *pcVar3;
  ptrlen pl;
  uint32_t failures;
  uint reply;
  PageantClientOp *pco;
  char **retstr_local;
  
  pco_00 = pageant_client_op_new();
  BinarySink_put_byte(pco_00->binarysink_,'\x1b');
  pl.len = 0x29;
  pl.ptr = "reencrypt-all@putty.projects.tartarus.org";
  BinarySink_put_stringpl(pco_00->binarysink_,pl);
  uVar1 = pageant_client_op_query(pco_00);
  uVar2 = BinarySource_get_uint32(pco_00->binarysource_);
  pageant_client_op_free(pco_00);
  if (uVar1 == 6) {
    if ((int)uVar2 == 1) {
      pcVar3 = dupstr("1 key remains unencrypted");
      *retstr = pcVar3;
      retstr_local._4_4_ = 3;
    }
    else if ((int)uVar2 == 0) {
      *retstr = (char *)0x0;
      retstr_local._4_4_ = 0;
    }
    else {
      pcVar3 = dupprintf("%u keys remain unencrypted",uVar2 & 0xffffffff);
      *retstr = pcVar3;
      retstr_local._4_4_ = 3;
    }
  }
  else {
    if (uVar1 == 5) {
      pcVar3 = dupstr("Agent doesn\'t support encrypted keys");
      *retstr = pcVar3;
    }
    else {
      pcVar3 = dupstr("Agent failed to re-encrypt any keys");
      *retstr = pcVar3;
    }
    retstr_local._4_4_ = 1;
  }
  return retstr_local._4_4_;
}

Assistant:

int pageant_reencrypt_all_keys(char **retstr)
{
    PageantClientOp *pco = pageant_client_op_new();
    put_byte(pco, SSH2_AGENTC_EXTENSION);
    put_stringpl(pco, extension_names[EXT_REENCRYPT_ALL]);
    unsigned reply = pageant_client_op_query(pco);
    uint32_t failures = get_uint32(pco);
    pageant_client_op_free(pco);
    if (reply != SSH_AGENT_SUCCESS) {
        if (reply == SSH_AGENT_FAILURE) {
            /* The agent didn't understand the protocol extension at all. */
            *retstr = dupstr("Agent doesn't support encrypted keys");
        } else {
            *retstr = dupstr("Agent failed to re-encrypt any keys");
        }
        return PAGEANT_ACTION_FAILURE;
    } else if (failures == 1) {
        /* special case for English grammar */
        *retstr = dupstr("1 key remains unencrypted");
        return PAGEANT_ACTION_WARNING;
    } else if (failures > 0) {
        *retstr = dupprintf("%"PRIu32" keys remain unencrypted", failures);
        return PAGEANT_ACTION_WARNING;
    } else {
        *retstr = NULL;
        return PAGEANT_ACTION_OK;
    }
}